

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IGeneratorTracker * __thiscall
Catch::RunContext::acquireGeneratorTracker
          (RunContext *this,StringRef generatorName,SourceLineInfo *lineInfo)

{
  GeneratorTracker *pGVar1;
  undefined8 *in_RCX;
  SourceLineInfo *in_RDI;
  NameAndLocation *in_stack_00000028;
  TrackerContext *in_stack_00000030;
  GeneratorTracker *tracker;
  string *_name;
  NameAndLocation *this_00;
  string local_78 [16];
  undefined8 in_stack_ffffffffffffff98;
  
  _name = (string *)&in_RDI[0x1c].line;
  this_00 = (NameAndLocation *)local_78;
  StringRef::operator_cast_to_string((StringRef *)in_stack_ffffffffffffff98);
  TestCaseTracking::NameAndLocation::NameAndLocation(this_00,_name,in_RDI);
  pGVar1 = Generators::GeneratorTracker::acquire(in_stack_00000030,in_stack_00000028);
  TestCaseTracking::NameAndLocation::~NameAndLocation((NameAndLocation *)0x132c0e);
  std::__cxx11::string::~string(local_78);
  in_RDI[0x17].file = (char *)*in_RCX;
  in_RDI[0x17].line = in_RCX[1];
  return &pGVar1->super_IGeneratorTracker;
}

Assistant:

auto RunContext::acquireGeneratorTracker( StringRef generatorName, SourceLineInfo const& lineInfo ) -> IGeneratorTracker& {
        using namespace Generators;
        GeneratorTracker& tracker = GeneratorTracker::acquire(m_trackerContext,
                                                              TestCaseTracking::NameAndLocation( static_cast<std::string>(generatorName), lineInfo ) );
        m_lastAssertionInfo.lineInfo = lineInfo;
        return tracker;
    }